

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_block_read_simple(BigBlock *bb,ptrdiff_t start,ptrdiff_t size,BigArray *array,char *dtype)

{
  int iVar1;
  int iVar2;
  void *buf;
  size_t sVar3;
  BigBlockPtr ptr;
  size_t dims [2];
  
  ptr.aoffset = 0;
  ptr.fileid = 0;
  ptr._4_4_ = 0;
  ptr.roffset = 0;
  if (dtype == (char *)0x0) {
    dtype = bb->dtype;
  }
  iVar1 = big_block_seek(bb,&ptr,start);
  if (iVar1 == 0) {
    sVar3 = bb->size - start;
    if ((ulong)(size + start) <= bb->size) {
      sVar3 = size;
    }
    if (-1 < (long)sVar3) {
      iVar2 = big_file_dtype_itemsize(dtype);
      iVar1 = bb->nmemb;
      buf = malloc((long)iVar2 * (long)iVar1 * sVar3);
      dims[0] = sVar3;
      dims[1] = (long)iVar1;
      big_array_init(array,buf,dtype,2,dims,(ptrdiff_t *)0x0);
      iVar1 = big_block_read(bb,&ptr,array);
      if (iVar1 != 0) {
        _big_file_raise("failed to read",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x314);
        free(buf);
        array->data = (void *)0x0;
        return -1;
      }
      return 0;
    }
    iVar1 = 0x309;
  }
  else {
    iVar1 = 0x302;
  }
  _big_file_raise("failed to seek",
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar1);
  return -1;
}

Assistant:

int
big_block_read_simple(BigBlock * bb, ptrdiff_t start, ptrdiff_t size, BigArray * array, const char * dtype)
{
    BigBlockPtr ptr = {0};
    if(dtype == NULL) {
        dtype = bb->dtype;
    }
    void * buffer;
    size_t dims[2];

    RAISEIF(0 != big_block_seek(bb, &ptr, start),
       ex_seek,
       "failed to seek"       
    );

    if(start + size > bb->size){
        size = bb->size - start;
    }
    RAISEIF(size < 0,
            ex_seek,
            "failed to seek");

    buffer = malloc(size * big_file_dtype_itemsize(dtype) * bb->nmemb);

    dims[0] = size;
    dims[1] = bb->nmemb;

    big_array_init(array, buffer, dtype, 2, dims, NULL);

    RAISEIF(0 != big_block_read(bb, &ptr, array),
            ex_read,
            "failed to read");
    return 0;
ex_read:
    free(buffer);
    array->data = NULL;
ex_seek:
    return -1;
}